

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_posix.c
# Opt level: O2

char * ethash_io_create_filename(char *dirname,char *filename,size_t filename_length)

{
  size_t dest_size;
  char cVar1;
  size_t count;
  char *dest;
  size_t __size;
  
  count = strlen(dirname);
  cVar1 = dirname[count];
  dest_size = count + 2 + filename_length;
  __size = count + filename_length + 1;
  if (cVar1 != '/') {
    __size = dest_size;
  }
  dest = (char *)malloc(__size);
  if (dest != (char *)0x0) {
    *dest = '\0';
    ethash_strncat(dest,__size,dirname,count);
    if (cVar1 != '/') {
      ethash_strncat(dest,dest_size,"/",1);
    }
    ethash_strncat(dest,__size,filename,filename_length);
  }
  return dest;
}

Assistant:

char* ethash_io_create_filename(
	char const* dirname,
	char const* filename,
	size_t filename_length
)
{
	size_t dirlen = strlen(dirname);
	size_t dest_size = dirlen + filename_length + 1;
	if (dirname[dirlen] != '/') {
		dest_size += 1;
	}
	char* name = malloc(dest_size);
	if (!name) {
		return NULL;
	}

	name[0] = '\0';
	ethash_strncat(name, dest_size, dirname, dirlen);
	if (dirname[dirlen] != '/') {
		ethash_strncat(name, dest_size, "/", 1);
	}
	ethash_strncat(name, dest_size, filename, filename_length);
	return name;
}